

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbor.c
# Opt level: O0

_Bool cn_cbor_array_replace(cn_cbor *cb_array,cn_cbor *cb_value,int index,cn_cbor_errback *errp)

{
  cn_cbor *pcVar1;
  cn_cbor *cb_temp2;
  cn_cbor *cb_temp;
  int i;
  cn_cbor_errback *errp_local;
  int index_local;
  cn_cbor *cb_value_local;
  cn_cbor *cb_array_local;
  
  if (((cb_array == (cn_cbor *)0x0) || (cb_value == (cn_cbor *)0x0)) ||
     (cb_array->type != CN_CBOR_ARRAY)) {
    if (errp != (cn_cbor_errback *)0x0) {
      errp->err = CN_CBOR_ERR_INVALID_PARAMETER;
    }
    cb_array_local._7_1_ = false;
  }
  else if (index == 0) {
    if (cb_array->length < 1) {
      cb_array_local._7_1_ = cn_cbor_array_append(cb_array,cb_value,errp);
    }
    else {
      pcVar1 = cb_array->first_child;
      cb_value->parent = cb_array;
      cb_value->next = pcVar1->next;
      if (cb_array->last_child == pcVar1) {
        cb_array->last_child = cb_value;
      }
      cb_array->first_child = cb_value;
      pcVar1->parent = (cn_cbor *)0x0;
      pcVar1->next = (cn_cbor *)0x0;
      cn_cbor_free(pcVar1);
      cb_array_local._7_1_ = true;
    }
  }
  else {
    if (cb_array->first_child == (cn_cbor *)0x0) {
      if (errp != (cn_cbor_errback *)0x0) {
        errp->err = CN_CBOR_NO_ERROR;
      }
      pcVar1 = (cn_cbor *)calloc(1,0x38);
      if (pcVar1 == (cn_cbor *)0x0) {
        if (errp != (cn_cbor_errback *)0x0) {
          errp->err = CN_CBOR_ERR_OUT_OF_MEMORY;
        }
        return false;
      }
      cb_array->last_child = pcVar1;
      cb_array->first_child = pcVar1;
      pcVar1->parent = cb_array;
      cb_array->length = 1;
      pcVar1->type = CN_CBOR_INVALID;
    }
    cb_temp2 = cb_array->first_child;
    for (cb_temp._4_4_ = 1; cb_temp._4_4_ < index; cb_temp._4_4_ = cb_temp._4_4_ + 1) {
      if (cb_temp2->next == (cn_cbor *)0x0) {
        if (errp != (cn_cbor_errback *)0x0) {
          errp->err = CN_CBOR_NO_ERROR;
        }
        pcVar1 = (cn_cbor *)calloc(1,0x38);
        if (pcVar1 == (cn_cbor *)0x0) {
          if (errp != (cn_cbor_errback *)0x0) {
            errp->err = CN_CBOR_ERR_OUT_OF_MEMORY;
          }
          return false;
        }
        pcVar1->type = CN_CBOR_INVALID;
        cb_temp2->next = pcVar1;
        pcVar1->parent = cb_array;
        cb_array->last_child = pcVar1;
        cb_array->length = cb_array->length + 1;
      }
      cb_temp2 = cb_temp2->next;
    }
    if (cb_temp2->next == (cn_cbor *)0x0) {
      cb_temp2->next = cb_value;
      cb_value->parent = cb_array;
      cb_array->last_child = cb_value;
      cb_array->length = cb_array->length + 1;
      cb_array_local._7_1_ = true;
    }
    else {
      pcVar1 = cb_temp2->next;
      cb_value->next = pcVar1->next;
      cb_temp2->next = cb_value;
      cb_value->parent = cb_array;
      if (cb_array->last_child == pcVar1) {
        cb_array->last_child = cb_value;
      }
      pcVar1->next = (cn_cbor *)0x0;
      pcVar1->parent = (cn_cbor *)0x0;
      cn_cbor_free(pcVar1);
      cb_array_local._7_1_ = true;
    }
  }
  return cb_array_local._7_1_;
}

Assistant:

bool cn_cbor_array_replace(cn_cbor * cb_array, cn_cbor * cb_value, int index, CBOR_CONTEXT_COMMA cn_cbor_errback *errp)
{
	int i;
	cn_cbor * cb_temp;
	cn_cbor * cb_temp2;

	if (!cb_array || !cb_value || cb_array->type != CN_CBOR_ARRAY) {
		if (errp != NULL) errp->err = CN_CBOR_ERR_INVALID_PARAMETER;
		return false;
	}

	if (index == 0) {
		if (cb_array->length > 0) {
			cb_temp = cb_array->first_child;

			cb_value->parent = cb_array;
			cb_value->next = cb_temp->next;
			if (cb_array->last_child == cb_temp) {
				cb_array->last_child = cb_value;
			}
			cb_array->first_child = cb_value;
			cb_temp->parent = NULL;
			cb_temp->next = NULL;
			cn_cbor_free(cb_temp CBOR_CONTEXT_PARAM);
			return true;
		}
		return cn_cbor_array_append(cb_array, cb_value, errp);
	}

	if (cb_array->first_child == NULL) {
		INIT_CB(cb_temp2);
		cb_array->first_child = cb_array->last_child = cb_temp2;
		cb_temp2->parent = cb_array;
		cb_array->length = 1;
		cb_temp2->type = CN_CBOR_INVALID;
	}

	cb_temp = cb_array->first_child;
	for (i = 1; i < index; i++) {
		if (cb_temp->next == NULL) {
			INIT_CB(cb_temp2);
			cb_temp2->type = CN_CBOR_INVALID;
			cb_temp->next = cb_temp2;
			cb_temp2->parent = cb_array;
			cb_array->last_child = cb_temp2;
			cb_array->length += 1;
		}

		cb_temp = cb_temp->next;
	}

	if (cb_temp->next == NULL) {
		cb_temp->next = cb_value;
		cb_value->parent = cb_array;
		cb_array->last_child = cb_value;
		cb_array->length += 1;
		return true;
	}

	cb_temp2 = cb_temp->next;
	cb_value->next = cb_temp2->next;
	cb_temp->next = cb_value;
	cb_value->parent = cb_array;
	if (cb_array->last_child == cb_temp2) {
		cb_array->last_child = cb_value;
	}

	cb_temp2->next = NULL;
	cb_temp2->parent = NULL;
	cn_cbor_free(cb_temp2 CBOR_CONTEXT_PARAM);

	return true;
}